

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void InterpolateRow_SSSE3
               (uint8_t *dst_ptr,uint8_t *src_ptr,ptrdiff_t src_stride,int dst_width,
               int source_y_fraction)

{
  uint8_t *puVar1;
  bool bVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  undefined1 auVar24 [16];
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  undefined1 auVar41 [16];
  ushort uVar54;
  ushort uVar55;
  undefined2 uVar56;
  undefined1 auVar57 [16];
  int dst_width_local;
  
  lVar5 = (long)dst_ptr - (long)src_ptr;
  if (source_y_fraction == 0) {
    do {
      uVar3 = *(undefined8 *)(src_ptr + 8);
      *(undefined8 *)(src_ptr + lVar5) = *(undefined8 *)src_ptr;
      *(undefined8 *)(src_ptr + lVar5 + 8) = uVar3;
      src_ptr = src_ptr + 0x10;
      iVar4 = dst_width + -0x10;
      bVar2 = 0xf < dst_width;
      dst_width = iVar4;
    } while (iVar4 != 0 && bVar2);
  }
  else if (source_y_fraction == 0x80) {
    do {
      puVar1 = src_ptr + src_stride;
      uVar6 = pavgb(*src_ptr,*puVar1);
      uVar7 = pavgb(src_ptr[1],puVar1[1]);
      uVar8 = pavgb(src_ptr[2],puVar1[2]);
      uVar9 = pavgb(src_ptr[3],puVar1[3]);
      uVar10 = pavgb(src_ptr[4],puVar1[4]);
      uVar11 = pavgb(src_ptr[5],puVar1[5]);
      uVar12 = pavgb(src_ptr[6],puVar1[6]);
      uVar13 = pavgb(src_ptr[7],puVar1[7]);
      uVar14 = pavgb(src_ptr[8],puVar1[8]);
      uVar15 = pavgb(src_ptr[9],puVar1[9]);
      uVar16 = pavgb(src_ptr[10],puVar1[10]);
      uVar17 = pavgb(src_ptr[0xb],puVar1[0xb]);
      uVar18 = pavgb(src_ptr[0xc],puVar1[0xc]);
      uVar19 = pavgb(src_ptr[0xd],puVar1[0xd]);
      uVar20 = pavgb(src_ptr[0xe],puVar1[0xe]);
      uVar21 = pavgb(src_ptr[0xf],puVar1[0xf]);
      puVar1 = src_ptr + lVar5;
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      puVar1[2] = uVar8;
      puVar1[3] = uVar9;
      puVar1[4] = uVar10;
      puVar1[5] = uVar11;
      puVar1[6] = uVar12;
      puVar1[7] = uVar13;
      puVar1[8] = uVar14;
      puVar1[9] = uVar15;
      puVar1[10] = uVar16;
      puVar1[0xb] = uVar17;
      puVar1[0xc] = uVar18;
      puVar1[0xd] = uVar19;
      puVar1[0xe] = uVar20;
      puVar1[0xf] = uVar21;
      src_ptr = src_ptr + 0x10;
      iVar4 = dst_width + -0x10;
      bVar2 = 0xf < dst_width;
      dst_width = iVar4;
    } while (iVar4 != 0 && bVar2);
  }
  else {
    uVar56 = CONCAT11((char)source_y_fraction,-(char)source_y_fraction);
    auVar57._0_4_ = CONCAT22(uVar56,uVar56);
    auVar57._4_4_ = auVar57._0_4_;
    auVar57._8_4_ = auVar57._0_4_;
    auVar57._12_4_ = auVar57._0_4_;
    do {
      puVar1 = src_ptr + src_stride;
      auVar24[0] = *src_ptr + 0x80;
      auVar24[1] = *puVar1 + 0x80;
      auVar24[2] = src_ptr[1] + 0x80;
      auVar24[3] = puVar1[1] + 0x80;
      auVar24[4] = src_ptr[2] + 0x80;
      auVar24[5] = puVar1[2] + 0x80;
      auVar24[6] = src_ptr[3] + 0x80;
      auVar24[7] = puVar1[3] + 0x80;
      auVar24[8] = src_ptr[4] + 0x80;
      auVar24[9] = puVar1[4] + 0x80;
      auVar24[10] = src_ptr[5] + 0x80;
      auVar24[0xb] = puVar1[5] + 0x80;
      auVar24[0xc] = src_ptr[6] + 0x80;
      auVar24[0xd] = puVar1[6] + 0x80;
      auVar24[0xe] = src_ptr[7] + 0x80;
      auVar24[0xf] = puVar1[7] + 0x80;
      auVar41[0] = src_ptr[8] + 0x80;
      auVar41[1] = puVar1[8] + 0x80;
      auVar41[2] = src_ptr[9] + 0x80;
      auVar41[3] = puVar1[9] + 0x80;
      auVar41[4] = src_ptr[10] + 0x80;
      auVar41[5] = puVar1[10] + 0x80;
      auVar41[6] = src_ptr[0xb] + 0x80;
      auVar41[7] = puVar1[0xb] + 0x80;
      auVar41[8] = src_ptr[0xc] + 0x80;
      auVar41[9] = puVar1[0xc] + 0x80;
      auVar41[10] = src_ptr[0xd] + 0x80;
      auVar41[0xb] = puVar1[0xd] + 0x80;
      auVar41[0xc] = src_ptr[0xe] + 0x80;
      auVar41[0xd] = puVar1[0xe] + 0x80;
      auVar41[0xe] = src_ptr[0xf] + 0x80;
      auVar41[0xf] = puVar1[0xf] + 0x80;
      auVar24 = pmaddubsw(auVar57,auVar24);
      auVar41 = pmaddubsw(auVar57,auVar41);
      uVar22 = auVar24._0_2_ + 0x8080;
      uVar25 = auVar24._2_2_ + 0x8080;
      uVar27 = auVar24._4_2_ + 0x8080;
      uVar29 = auVar24._6_2_ + 0x8080;
      uVar31 = auVar24._8_2_ + 0x8080;
      uVar33 = auVar24._10_2_ + 0x8080;
      uVar35 = auVar24._12_2_ + 0x8080;
      uVar37 = auVar24._14_2_ + 0x8080;
      uVar39 = auVar41._0_2_ + 0x8080;
      uVar42 = auVar41._2_2_ + 0x8080;
      uVar44 = auVar41._4_2_ + 0x8080;
      uVar46 = auVar41._6_2_ + 0x8080;
      uVar48 = auVar41._8_2_ + 0x8080;
      uVar50 = auVar41._10_2_ + 0x8080;
      uVar52 = auVar41._12_2_ + 0x8080;
      uVar54 = auVar41._14_2_ + 0x8080;
      uVar23 = uVar22 >> 8;
      uVar26 = uVar25 >> 8;
      uVar28 = uVar27 >> 8;
      uVar30 = uVar29 >> 8;
      uVar32 = uVar31 >> 8;
      uVar34 = uVar33 >> 8;
      uVar36 = uVar35 >> 8;
      uVar38 = uVar37 >> 8;
      uVar40 = uVar39 >> 8;
      uVar43 = uVar42 >> 8;
      uVar45 = uVar44 >> 8;
      uVar47 = uVar46 >> 8;
      uVar49 = uVar48 >> 8;
      uVar51 = uVar50 >> 8;
      uVar53 = uVar52 >> 8;
      uVar55 = uVar54 >> 8;
      puVar1 = src_ptr + lVar5;
      *puVar1 = (uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar23);
      puVar1[1] = (uVar26 != 0) * (uVar26 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar26);
      puVar1[2] = (uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) - (0xff < uVar28);
      puVar1[3] = (uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) - (0xff < uVar30);
      puVar1[4] = (uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar32);
      puVar1[5] = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
      puVar1[6] = (uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) - (0xff < uVar36);
      puVar1[7] = (uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) - (0xff < uVar38);
      puVar1[8] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
      puVar1[9] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
      puVar1[10] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
      puVar1[0xb] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47);
      puVar1[0xc] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
      puVar1[0xd] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar51);
      puVar1[0xe] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
      puVar1[0xf] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
      src_ptr = src_ptr + 0x10;
      iVar4 = dst_width + -0x10;
      bVar2 = 0xf < dst_width;
      dst_width = iVar4;
    } while (iVar4 != 0 && bVar2);
  }
  return;
}

Assistant:

void InterpolateRow_SSSE3(uint8_t* dst_ptr,
                          const uint8_t* src_ptr,
                          ptrdiff_t src_stride,
                          int dst_width,
                          int source_y_fraction) {
  asm volatile(
      "sub         %1,%0                         \n"
      "cmp         $0x0,%3                       \n"
      "je          100f                          \n"
      "cmp         $0x80,%3                      \n"
      "je          50f                           \n"

      "movd        %3,%%xmm0                     \n"
      "neg         %3                            \n"
      "add         $0x100,%3                     \n"
      "movd        %3,%%xmm5                     \n"
      "punpcklbw   %%xmm0,%%xmm5                 \n"
      "punpcklwd   %%xmm5,%%xmm5                 \n"
      "pshufd      $0x0,%%xmm5,%%xmm5            \n"
      "mov         $0x80808080,%%eax             \n"
      "movd        %%eax,%%xmm4                  \n"
      "pshufd      $0x0,%%xmm4,%%xmm4            \n"

      // General purpose row blend.
      LABELALIGN
      "1:                                        \n"
      "movdqu      (%1),%%xmm0                   \n"
      "movdqu      0x00(%1,%4,1),%%xmm2          \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "punpcklbw   %%xmm2,%%xmm0                 \n"
      "punpckhbw   %%xmm2,%%xmm1                 \n"
      "psubb       %%xmm4,%%xmm0                 \n"
      "psubb       %%xmm4,%%xmm1                 \n"
      "movdqa      %%xmm5,%%xmm2                 \n"
      "movdqa      %%xmm5,%%xmm3                 \n"
      "pmaddubsw   %%xmm0,%%xmm2                 \n"
      "pmaddubsw   %%xmm1,%%xmm3                 \n"
      "paddw       %%xmm4,%%xmm2                 \n"
      "paddw       %%xmm4,%%xmm3                 \n"
      "psrlw       $0x8,%%xmm2                   \n"
      "psrlw       $0x8,%%xmm3                   \n"
      "packuswb    %%xmm3,%%xmm2                 \n"
      "movdqu      %%xmm2,0x00(%1,%0,1)          \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x10,%2                      \n"
      "jg          1b                            \n"
      "jmp         99f                           \n"

      // Blend 50 / 50.
      LABELALIGN
      "50:                                       \n"
      "movdqu      (%1),%%xmm0                   \n"
      "movdqu      0x00(%1,%4,1),%%xmm1          \n"
      "pavgb       %%xmm1,%%xmm0                 \n"
      "movdqu      %%xmm0,0x00(%1,%0,1)          \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x10,%2                      \n"
      "jg          50b                           \n"
      "jmp         99f                           \n"

      // Blend 100 / 0 - Copy row unchanged.
      LABELALIGN
      "100:                                      \n"
      "movdqu      (%1),%%xmm0                   \n"
      "movdqu      %%xmm0,0x00(%1,%0,1)          \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x10,%2                      \n"
      "jg          100b                          \n"

      "99:                                       \n"
      : "+r"(dst_ptr),               // %0
        "+r"(src_ptr),               // %1
        "+rm"(dst_width),            // %2
        "+r"(source_y_fraction)      // %3
      : "r"((intptr_t)(src_stride))  // %4
      : "memory", "cc", "eax", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5");
}